

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519-donna-helpers.h
# Opt level: O1

void curve25519_recip(uint64_t *out,uint64_t *z)

{
  bignum25519 b;
  bignum25519 t0;
  bignum25519 a;
  uint64_t auStack_b8 [6];
  uint64_t local_88 [6];
  uint64_t local_58 [6];
  
  curve25519_square_times(local_58,z,1);
  curve25519_square_times(local_88,local_58,2);
  curve25519_mul_noinline(auStack_b8,local_88,z);
  curve25519_mul_noinline(local_58,auStack_b8,local_58);
  curve25519_square_times(local_88,local_58,1);
  curve25519_mul_noinline(auStack_b8,local_88,auStack_b8);
  curve25519_pow_two5mtwo0_two250mtwo0(auStack_b8);
  curve25519_square_times(auStack_b8,auStack_b8,5);
  curve25519_mul_noinline(out,auStack_b8,local_58);
  return;
}

Assistant:

static void
curve25519_recip(bignum25519 out, const bignum25519 z) {
	bignum25519 ALIGN(16) a,t0,b;

	/* 2 */ curve25519_square_times(a, z, 1); /* a = 2 */
	/* 8 */ curve25519_square_times(t0, a, 2);
	/* 9 */ curve25519_mul_noinline(b, t0, z); /* b = 9 */
	/* 11 */ curve25519_mul_noinline(a, b, a); /* a = 11 */
	/* 22 */ curve25519_square_times(t0, a, 1);
	/* 2^5 - 2^0 = 31 */ curve25519_mul_noinline(b, t0, b);
	/* 2^250 - 2^0 */ curve25519_pow_two5mtwo0_two250mtwo0(b);
	/* 2^255 - 2^5 */ curve25519_square_times(b, b, 5);
	/* 2^255 - 21 */ curve25519_mul_noinline(out, b, a);
}